

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_That_Test::Body(iu_SyntaxTest_x_iutest_x_That_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  AssertionResult *in_R8;
  int x;
  AssertionResult iutest_ar;
  iu_global_format_stringstream strm;
  int local_3cc;
  AssertionResult local_3c8;
  detail *local_3a0;
  long local_390 [2];
  string local_380;
  AssertionHelper local_360;
  undefined1 local_330 [16];
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [392];
  
  local_3cc = 1;
  local_1a8._0_4_ = 1;
  local_330._0_8_ = &PTR__IMatcher_003abce8;
  local_330._8_8_ = local_1a8;
  iutest::detail::EqMatcher<int>::operator()(&local_3c8,(EqMatcher<int> *)local_330,&local_3cc);
  bVar2 = local_3c8.m_result;
  if (local_3c8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    local_330._0_4_ = local_3cc;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)local_330);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_330);
    std::ostream::operator<<(local_320,local_3cc);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
    std::ios_base::~ios_base(local_2b0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_380,local_3a0,"::iutest::Eq(1)",(char *)&local_3c8,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,local_380._M_dataplus._M_p,(allocator<char> *)local_330);
    local_360.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_360.m_part_result.super_iuCodeMessage.m_line = 0x273;
    local_360.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_360,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_360.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_360.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_360.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if (local_3a0 != (detail *)local_390) {
      operator_delete(local_3a0,local_390[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.m_message._M_dataplus._M_p != &local_3c8.m_message.field_2) {
    operator_delete(local_3c8.m_message._M_dataplus._M_p,
                    local_3c8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    local_3cc = 1;
    local_1a8._0_4_ = 1;
    local_330._0_8_ = &PTR__IMatcher_003abd28;
    local_330._8_8_ = local_1a8;
    iutest::detail::LeMatcher<int>::operator()(&local_3c8,(LeMatcher<int> *)local_330,&local_3cc);
    if (local_3c8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_330._0_4_ = local_3cc;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)local_330);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_330);
      std::ostream::operator<<(local_320,local_3cc);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
      std::ios_base::~ios_base(local_2b0);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_380,local_3a0,"::iutest::Le(1)",(char *)&local_3c8,in_R8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,local_380._M_dataplus._M_p,(allocator<char> *)local_330);
      local_360.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_360.m_part_result.super_iuCodeMessage.m_line = 0x275;
      local_360.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_360,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_360.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_360.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_360.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if (local_3a0 != (detail *)local_390) {
        operator_delete(local_3a0,local_390[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    paVar1 = &local_3c8.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c8.m_message._M_dataplus._M_p,
                      local_3c8.m_message.field_2._M_allocated_capacity + 1);
    }
    local_3cc = 1;
    local_1a8._0_4_ = 1;
    local_330._0_8_ = &PTR__IMatcher_003abd68;
    local_330._8_8_ = local_1a8;
    iutest::detail::GeMatcher<int>::operator()(&local_3c8,(GeMatcher<int> *)local_330,&local_3cc);
    if (local_3c8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_330._0_4_ = local_3cc;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)local_330);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_330);
      std::ostream::operator<<(local_320,local_3cc);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
      std::ios_base::~ios_base(local_2b0);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_380,local_3a0,"::iutest::Ge(1)",(char *)&local_3c8,in_R8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,local_380._M_dataplus._M_p,(allocator<char> *)local_330);
      local_360.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_360.m_part_result.super_iuCodeMessage.m_line = 0x277;
      local_360.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_360,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_360.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_360.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_360.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if (local_3a0 != (detail *)local_390) {
        operator_delete(local_3a0,local_390[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c8.m_message._M_dataplus._M_p,
                      local_3c8.m_message.field_2._M_allocated_capacity + 1);
    }
    local_3cc = 1;
    local_1a8._0_4_ = 0;
    local_330._0_8_ = &PTR__IMatcher_003abda8;
    local_330._8_8_ = local_1a8;
    iutest::detail::NeMatcher<int>::operator()(&local_3c8,(NeMatcher<int> *)local_330,&local_3cc);
    if (local_3c8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_330._0_4_ = local_3cc;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)local_330);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_330);
      std::ostream::operator<<(local_320,local_3cc);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
      std::ios_base::~ios_base(local_2b0);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_380,local_3a0,"::iutest::Ne(0)",(char *)&local_3c8,in_R8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,local_380._M_dataplus._M_p,(allocator<char> *)local_330);
      local_360.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_360.m_part_result.super_iuCodeMessage.m_line = 0x279;
      local_360.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_360,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_360.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_360.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_360.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if (local_3a0 != (detail *)local_390) {
        operator_delete(local_3a0,local_390[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c8.m_message._M_dataplus._M_p,
                      local_3c8.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, That)
{
    if( int x=1 )
        IUTEST_ASSERT_THAT(x, ::iutest::Eq(1)) << x;
    if( int x=1 )
        IUTEST_EXPECT_THAT(x, ::iutest::Le(1)) << x;
    if( int x=1 )
        IUTEST_INFORM_THAT(x, ::iutest::Ge(1)) << x;
    if( int x=1 )
        IUTEST_ASSUME_THAT(x, ::iutest::Ne(0)) << x;
}